

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStateUpdatePdu.cpp
# Opt level: O2

void __thiscall DIS::EntityStateUpdatePdu::EntityStateUpdatePdu(EntityStateUpdatePdu *this)

{
  EntityInformationFamilyPdu::EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  (this->super_EntityInformationFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__EntityStateUpdatePdu_001c1730;
  EntityID::EntityID(&this->_entityID);
  this->_padding1 = '\0';
  this->_numberOfVariableParameters = '\0';
  Vector3Float::Vector3Float(&this->_entityLinearVelocity);
  Vector3Double::Vector3Double(&this->_entityLocation);
  EulerAngles::EulerAngles(&this->_entityOrientation);
  this->_entityAppearance = 0;
  (this->_variableParameters).
  super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_variableParameters).
  super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_variableParameters).
  super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PduSuperclass::setPduType((PduSuperclass *)this,'C');
  PduSuperclass::setProtocolFamily((PduSuperclass *)this,'\x01');
  return;
}

Assistant:

EntityStateUpdatePdu::EntityStateUpdatePdu() : EntityInformationFamilyPdu(),
   _entityID(), 
   _padding1(0), 
   _numberOfVariableParameters(0), 
   _entityLinearVelocity(), 
   _entityLocation(), 
   _entityOrientation(), 
   _entityAppearance(0)
{
    setPduType( 67 );
    setProtocolFamily( 1 );
}